

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlBufferPtr xmlBufferCreateStatic(void *mem,size_t size)

{
  xmlBufferPtr pxVar1;
  
  pxVar1 = (xmlBufferPtr)0x0;
  if ((mem != (void *)0x0) && (0xffffffff00000000 < size - 0x100000000)) {
    pxVar1 = (xmlBufferPtr)(*xmlMalloc)(0x20);
    if (pxVar1 == (xmlBufferPtr)0x0) {
      pxVar1 = (xmlBufferPtr)0x0;
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"creating buffer");
    }
    else {
      pxVar1->use = (uint)size;
      pxVar1->size = (uint)size;
      pxVar1->alloc = XML_BUFFER_ALLOC_IMMUTABLE;
      pxVar1->content = (xmlChar *)mem;
    }
  }
  return pxVar1;
}

Assistant:

xmlBufferPtr
xmlBufferCreateStatic(void *mem, size_t size) {
    xmlBufferPtr ret;

    if ((mem == NULL) || (size == 0))
        return(NULL);
    if (size > UINT_MAX)
        return(NULL);

    ret = (xmlBufferPtr) xmlMalloc(sizeof(xmlBuffer));
    if (ret == NULL) {
	xmlTreeErrMemory("creating buffer");
        return(NULL);
    }
    ret->use = size;
    ret->size = size;
    ret->alloc = XML_BUFFER_ALLOC_IMMUTABLE;
    ret->content = (xmlChar *) mem;
    return(ret);
}